

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

Memory __thiscall
google::protobuf::internal::SerialArena::Free<google::protobuf::internal::GetDeallocator>
          (SerialArena *this,GetDeallocator deallocator)

{
  size_t *psVar1;
  Memory mem_00;
  Memory MVar2;
  Block *b;
  SerialArena *this_local;
  GetDeallocator deallocator_local;
  Memory mem;
  
  deallocator_local.dealloc_ = (_func_void_void_ptr_size_t *)deallocator.space_allocated_;
  this_local = (SerialArena *)deallocator.dealloc_;
  mem.ptr = (void *)this->head_->size;
  deallocator_local.space_allocated_ = (size_t *)this->head_;
  while (*deallocator_local.space_allocated_ != 0) {
    psVar1 = (size_t *)*deallocator_local.space_allocated_;
    mem_00.size = (size_t)mem.ptr;
    mem_00.ptr = deallocator_local.space_allocated_;
    GetDeallocator::operator()((GetDeallocator *)&this_local,mem_00);
    mem.ptr = (void *)psVar1[1];
    deallocator_local.space_allocated_ = psVar1;
  }
  MVar2.size = (size_t)mem.ptr;
  MVar2.ptr = deallocator_local.space_allocated_;
  return MVar2;
}

Assistant:

SerialArena::Memory SerialArena::Free(Deallocator deallocator) {
  Block* b = head_;
  Memory mem = {b, b->size};
  while (b->next) {
    b = b->next;  // We must first advance before deleting this block
    deallocator(mem);
    mem = {b, b->size};
  }
  return mem;
}